

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O2

void __thiscall
chrono::ChLoad<chrono::ChLoaderGravity>::ComputeJacobian
          (ChLoad<chrono::ChLoaderGravity> *this,ChState *state_x,ChStateDelta *state_w,
          ChMatrixRef *mK,ChMatrixRef *mR,ChMatrixRef *mM)

{
  ChLoaderGravity *this_00;
  ChVectorDynamic<> *src;
  int iVar1;
  ulong uVar2;
  Scalar *pSVar3;
  int i;
  long lVar4;
  int i_1;
  int mrows_w;
  double local_110;
  ChVectorDynamic<> Q1;
  ChVectorDynamic<> Q0;
  ChVectorDynamic<> Jcolumn;
  ChStateDelta state_delta;
  ChState state_x_inc;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_88;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_70;
  
  mrows_w = (*(this->super_ChLoadBase).super_ChObj._vptr_ChObj[7])();
  iVar1 = (*(this->super_ChLoadBase).super_ChObj._vptr_ChObj[6])(this);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&Q0,&mrows_w);
  this_00 = &this->loader;
  ChLoaderUVWdistributed::ComputeQ
            (&this_00->super_ChLoaderUVWdistributed,&state_x->super_ChVectorDynamic<double>,
             &state_w->super_ChVectorDynamic<double>);
  src = &(this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.super_ChLoader.Q;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>(&Q0,src);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&Q1,&mrows_w);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&Jcolumn,&mrows_w);
  ChState::ChState(&state_x_inc,(long)iVar1,(ChIntegrable *)0x0);
  ChStateDelta::ChStateDelta(&state_delta,(long)mrows_w,(ChIntegrable *)0x0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&state_delta,(long)mrows_w)
  ;
  state_delta.integrable = (ChIntegrable *)0x0;
  for (lVar4 = 0; uVar2 = (ulong)mrows_w, lVar4 < (long)uVar2; lVar4 = lVar4 + 1) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&state_delta,
                        lVar4);
    *pSVar3 = *pSVar3 + 1e-08;
    (*(this->super_ChLoadBase).super_ChObj._vptr_ChObj[10])(this,state_x,&state_delta,&state_x_inc);
    ChLoaderUVWdistributed::ComputeQ
              (&this_00->super_ChLoaderUVWdistributed,&state_x_inc.super_ChVectorDynamic<double>,
               &state_w->super_ChVectorDynamic<double>);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>(&Q1,src);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&state_delta,
                        lVar4);
    *pSVar3 = *pSVar3 + -1e-08;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              (&local_88,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&Q1,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&Q0);
    local_110 = -100000000.0;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
    ::operator*(&local_70,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                 *)&local_88,&local_110);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              (&Jcolumn,&local_70);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::block<int,int>
              ((Type *)&local_70,&((this->super_ChLoadBase).jacobians)->K,0,lVar4,mrows_w,1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,_1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false> *)&local_70,&Jcolumn)
    ;
  }
  for (lVar4 = 0; lVar4 < (int)uVar2; lVar4 = lVar4 + 1) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)state_w,lVar4)
    ;
    *pSVar3 = *pSVar3 + 1e-08;
    ChLoaderUVWdistributed::ComputeQ
              (&this_00->super_ChLoaderUVWdistributed,&state_x->super_ChVectorDynamic<double>,
               &state_w->super_ChVectorDynamic<double>);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>(&Q1,src);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)state_w,lVar4)
    ;
    *pSVar3 = *pSVar3 + -1e-08;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              (&local_88,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&Q1,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&Q0);
    local_110 = -100000000.0;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
    ::operator*(&local_70,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                 *)&local_88,&local_110);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              (&Jcolumn,&local_70);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::block<int,int>
              ((Type *)&local_70,&((this->super_ChLoadBase).jacobians)->R,0,lVar4,mrows_w,1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,_1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false> *)&local_70,&Jcolumn)
    ;
    uVar2 = (ulong)(uint)mrows_w;
  }
  Eigen::internal::handmade_aligned_free
            (state_delta.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (state_x_inc.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (Jcolumn.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            );
  Eigen::internal::handmade_aligned_free
            (Q1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (Q0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

inline void ChLoad<Tloader>::ComputeJacobian(ChState* state_x,
                                             ChStateDelta* state_w,
                                             ChMatrixRef mK,
                                             ChMatrixRef mR,
                                             ChMatrixRef mM) {
    double Delta = 1e-8;

    int mrows_w = this->LoadGet_ndof_w();
    int mrows_x = this->LoadGet_ndof_x();

    // compute Q at current speed & position, x_0, v_0
    ChVectorDynamic<> Q0(mrows_w);
    this->loader.ComputeQ(state_x, state_w);  // Q0 = Q(x, v)
    Q0 = this->loader.Q;

    ChVectorDynamic<> Q1(mrows_w);
    ChVectorDynamic<> Jcolumn(mrows_w);
    ChState state_x_inc(mrows_x, nullptr);
    ChStateDelta state_delta(mrows_w, nullptr);

    // Compute K=-dQ(x,v)/dx by backward differentiation
    state_delta.setZero(mrows_w, nullptr);

    for (int i = 0; i < mrows_w; ++i) {
        state_delta(i) += Delta;
        this->LoadStateIncrement(*state_x, state_delta,
                                 state_x_inc);         // exponential, usually state_x_inc(i) = state_x(i) + Delta;
        this->loader.ComputeQ(&state_x_inc, state_w);  // Q1 = Q(x+Dx, v)
        Q1 = this->loader.Q;
        state_delta(i) -= Delta;

        Jcolumn = (Q1 - Q0) * (-1.0 / Delta);  // - sign because K=-dQ/dx
        this->jacobians->K.block(0, i, mrows_w, 1) = Jcolumn;
    }
    // Compute R=-dQ(x,v)/dv by backward differentiation
    for (int i = 0; i < mrows_w; ++i) {
        (*state_w)(i) += Delta;
        this->loader.ComputeQ(state_x, state_w);  // Q1 = Q(x, v+Dv)
        Q1 = this->loader.Q;
        (*state_w)(i) -= Delta;

        Jcolumn = (Q1 - Q0) * (-1.0 / Delta);  // - sign because R=-dQ/dv
        this->jacobians->R.block(0, i, mrows_w, 1) = Jcolumn;
    }
}